

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fork.c
# Opt level: O2

int run_test_fork_socketpair(void)

{
  int iVar1;
  __pid_t child_pid;
  undefined8 uVar2;
  ssize_t sVar3;
  uv_loop_t *loop;
  char *pcVar4;
  int socket_fds [2];
  uv_poll_t poll_handle;
  
  run_timer_loop_once();
  iVar1 = socketpair(1,1,0,socket_fds);
  if (iVar1 == 0) {
    uVar2 = uv_default_loop();
    iVar1 = uv_poll_init(uVar2,&poll_handle,socket_fds[0]);
    if (iVar1 == 0) {
      child_pid = fork();
      if (child_pid == 0) {
        uVar2 = uv_default_loop();
        iVar1 = uv_loop_fork(uVar2);
        if (iVar1 != 0) {
          pcVar4 = "0 == uv_loop_fork(uv_default_loop())";
          uVar2 = 0x8f;
          goto LAB_00118970;
        }
        if (socket_cb_called != 0) {
          pcVar4 = "0 == socket_cb_called";
          uVar2 = 0x90;
          goto LAB_00118970;
        }
        iVar1 = uv_poll_start(&poll_handle,1,socket_cb);
        if (iVar1 != 0) {
          pcVar4 = "0 == uv_poll_start(&poll_handle, UV_READABLE, socket_cb)";
          uVar2 = 0x91;
          goto LAB_00118970;
        }
        puts("Going to run the loop in the child");
        uVar2 = uv_default_loop();
        iVar1 = uv_run(uVar2,0);
        if (iVar1 != 0) {
          pcVar4 = "0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT)";
          uVar2 = 0x93;
          goto LAB_00118970;
        }
        if (socket_cb_called != 1) {
          pcVar4 = "1 == socket_cb_called";
          uVar2 = 0x94;
          goto LAB_00118970;
        }
      }
      else {
        if (child_pid == -1) {
          pcVar4 = "child_pid != -1";
          uVar2 = 0x87;
          goto LAB_00118970;
        }
        sVar3 = send(socket_fds[1],"hi\n",3,0);
        if (sVar3 != 3) {
          pcVar4 = "3 == send(socket_fds[1], \"hi\\n\", 3, 0)";
          uVar2 = 0x8b;
          goto LAB_00118970;
        }
        assert_wait_child(child_pid);
      }
      loop = (uv_loop_t *)uv_default_loop();
      close_loop(loop);
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      pcVar4 = "0 == uv_loop_close(uv_default_loop())";
      uVar2 = 0x97;
    }
    else {
      pcVar4 = "0 == uv_poll_init(uv_default_loop(), &poll_handle, socket_fds[0])";
      uVar2 = 0x84;
    }
  }
  else {
    pcVar4 = "0 == socketpair(AF_UNIX, SOCK_STREAM, 0, socket_fds)";
    uVar2 = 0x81;
  }
LAB_00118970:
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fork.c",
          uVar2,pcVar4);
  abort();
}

Assistant:

TEST_IMPL(fork_socketpair) {
  /* A socket opened in the parent and accept'd in the
     child works after a fork. */
  pid_t child_pid;
  int socket_fds[2];
  uv_poll_t poll_handle;

  /* Prime the loop. */
  run_timer_loop_once();

  ASSERT(0 == socketpair(AF_UNIX, SOCK_STREAM, 0, socket_fds));

  /* Create the server watcher in the parent, use it in the child. */
  ASSERT(0 == uv_poll_init(uv_default_loop(), &poll_handle, socket_fds[0]));

  child_pid = fork();
  ASSERT(child_pid != -1);

  if (child_pid != 0) {
    /* parent */
    ASSERT(3 == send(socket_fds[1], "hi\n", 3, 0));
    assert_wait_child(child_pid);
  } else {
    /* child */
    ASSERT(0 == uv_loop_fork(uv_default_loop()));
    ASSERT(0 == socket_cb_called);
    ASSERT(0 == uv_poll_start(&poll_handle, UV_READABLE, socket_cb));
    printf("Going to run the loop in the child\n");
    ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT));
    ASSERT(1 == socket_cb_called);
  }

  MAKE_VALGRIND_HAPPY();
  return 0;
}